

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CAnimatedMeshSceneNode::buildFrameNr(CAnimatedMeshSceneNode *this,u32 timeMs)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  float fVar2;
  
  if (((*(float *)(in_RDI + 0x138) != 0.0) || (NAN(*(float *)(in_RDI + 0x138)))) &&
     (*(float *)(in_RDI + 0x13c) =
           (float)in_ESI * *(float *)(in_RDI + 0x138) + *(float *)(in_RDI + 0x13c),
     1.0 < *(float *)(in_RDI + 0x13c))) {
    *(undefined4 *)(in_RDI + 0x138) = 0;
    *(undefined4 *)(in_RDI + 0x13c) = 0;
  }
  if (*(int *)(in_RDI + 0x120) == *(int *)(in_RDI + 0x124)) {
    *(float *)(in_RDI + 300) = (float)*(int *)(in_RDI + 0x120);
  }
  else if ((*(byte *)(in_RDI + 0x145) & 1) == 0) {
    *(float *)(in_RDI + 300) = (float)in_ESI * *(float *)(in_RDI + 0x128) + *(float *)(in_RDI + 300)
    ;
    if (*(float *)(in_RDI + 0x128) <= 0.0) {
      if ((*(float *)(in_RDI + 300) < (float)*(int *)(in_RDI + 0x120)) &&
         (*(float *)(in_RDI + 300) = (float)*(int *)(in_RDI + 0x120), *(long *)(in_RDI + 0x148) != 0
         )) {
        (**(code **)**(undefined8 **)(in_RDI + 0x148))();
      }
    }
    else if (((float)*(int *)(in_RDI + 0x124) < *(float *)(in_RDI + 300)) &&
            (*(float *)(in_RDI + 300) = (float)*(int *)(in_RDI + 0x124),
            *(long *)(in_RDI + 0x148) != 0)) {
      (**(code **)**(undefined8 **)(in_RDI + 0x148))();
    }
  }
  else {
    *(float *)(in_RDI + 300) = (float)in_ESI * *(float *)(in_RDI + 0x128) + *(float *)(in_RDI + 300)
    ;
    if (*(float *)(in_RDI + 0x128) <= 0.0) {
      if (*(float *)(in_RDI + 300) < (float)*(int *)(in_RDI + 0x120)) {
        iVar1 = *(int *)(in_RDI + 0x124);
        fVar2 = fmodf((float)*(int *)(in_RDI + 0x124) - *(float *)(in_RDI + 300),
                      (float)(*(int *)(in_RDI + 0x124) - *(int *)(in_RDI + 0x120)));
        *(float *)(in_RDI + 300) = (float)iVar1 - fVar2;
      }
    }
    else if ((float)*(int *)(in_RDI + 0x124) < *(float *)(in_RDI + 300)) {
      iVar1 = *(int *)(in_RDI + 0x120);
      fVar2 = fmodf(*(float *)(in_RDI + 300) - (float)*(int *)(in_RDI + 0x120),
                    (float)(*(int *)(in_RDI + 0x124) - *(int *)(in_RDI + 0x120)));
      *(float *)(in_RDI + 300) = (float)iVar1 + fVar2;
    }
  }
  return;
}

Assistant:

void CAnimatedMeshSceneNode::buildFrameNr(u32 timeMs)
{
	if (Transiting != 0.f) {
		TransitingBlend += (f32)(timeMs)*Transiting;
		if (TransitingBlend > 1.f) {
			Transiting = 0.f;
			TransitingBlend = 0.f;
		}
	}

	if (StartFrame == EndFrame) {
		CurrentFrameNr = (f32)StartFrame; // Support for non animated meshes
	} else if (Looping) {
		// play animation looped
		CurrentFrameNr += timeMs * FramesPerSecond;

		// We have no interpolation between EndFrame and StartFrame,
		// the last frame must be identical to first one with our current solution.
		if (FramesPerSecond > 0.f) { // forwards...
			if (CurrentFrameNr > EndFrame)
				CurrentFrameNr = StartFrame + fmodf(CurrentFrameNr - StartFrame, (f32)(EndFrame - StartFrame));
		} else // backwards...
		{
			if (CurrentFrameNr < StartFrame)
				CurrentFrameNr = EndFrame - fmodf(EndFrame - CurrentFrameNr, (f32)(EndFrame - StartFrame));
		}
	} else {
		// play animation non looped

		CurrentFrameNr += timeMs * FramesPerSecond;
		if (FramesPerSecond > 0.f) { // forwards...
			if (CurrentFrameNr > (f32)EndFrame) {
				CurrentFrameNr = (f32)EndFrame;
				if (LoopCallBack)
					LoopCallBack->OnAnimationEnd(this);
			}
		} else // backwards...
		{
			if (CurrentFrameNr < (f32)StartFrame) {
				CurrentFrameNr = (f32)StartFrame;
				if (LoopCallBack)
					LoopCallBack->OnAnimationEnd(this);
			}
		}
	}
}